

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cc
# Opt level: O3

void increment(char *s)

{
  size_t sVar1;
  ulong uVar2;
  
  sVar1 = strlen(s);
  if (0 < (int)(uint)sVar1) {
    uVar2 = (ulong)((uint)sVar1 & 0x7fffffff) + 1;
    do {
      if (s[uVar2 - 2] != '9') {
        s[uVar2 - 2] = s[uVar2 - 2] + '\x01';
        return;
      }
      s[uVar2 - 2] = '0';
      uVar2 = uVar2 - 1;
    } while (1 < uVar2);
  }
  return;
}

Assistant:

void increment(char *s) {
  for (int i = static_cast<int>(std::strlen(s)) - 1; i >= 0; --i) {
    if (s[i] != '9') {
      ++s[i];
      break;
    }
    s[i] = '0';
  }
}